

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

int __thiscall rlist::listIndex(rlist *this,void *value)

{
  int iVar1;
  int iVar2;
  listNode *ptr;
  rlist *this_00;
  
  ptr = this->rl->head;
  if (ptr == (listNode *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = -1;
    this_00 = this;
    while (this->view = ptr, ptr != (listNode *)0x0) {
      iVar1 = match(this_00,ptr,value);
      if (iVar1 != 0) {
        return iVar2 + 1;
      }
      iVar2 = iVar2 + 1;
      ptr = this->view->next;
    }
  }
  return iVar2;
}

Assistant:

int rlist::listIndex(void *value){
    int index=-1;
    if(rl->head!=NULL){
        view=rl->head;
        while(view!=NULL){
            index++;
            if(rlist::match(view,value))
                return index;
            view=view->next;  
        }
    }
    return index;
}